

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

CNode * __thiscall
CConnman::ConnectNode
          (CConnman *this,CAddress addrConnect,char *pszDest,bool fCountFailure,
          ConnectionType conn_type,bool use_v2transport)

{
  queue<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>_>
  *this_00;
  atomic<long> *paVar1;
  uint64_t data;
  Session *this_01;
  _Elt_pointer puVar2;
  __uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true> _Var3;
  AddrMan *this_02;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  DNSLookupFn dns_lookup_function;
  CService ipIn;
  CService ipIn_00;
  unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> uVar4;
  size_type sVar5;
  undefined8 __p;
  bool bVar6;
  uint16_t uVar7;
  Network net;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar8;
  Logger *pLVar9;
  CNode *pCVar10;
  size_type sVar11;
  CSipHasher *this_03;
  uint64_t nKeyedNetGroupIn;
  CAddress *addrIn;
  uint16_t port_00;
  undefined7 in_register_00000011;
  _Alloc_hider _Var12;
  int iVar13;
  undefined7 in_register_00000081;
  double *in_R9;
  double *args_2;
  __uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> service;
  _Alloc_hider sock;
  char *pcVar14;
  _Alloc_hider address;
  long in_FS_OFFSET;
  double dVar15;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view source_file_02;
  string_view source_file_03;
  shared_ptr<Sock> sock_00;
  string_view logging_function_02;
  string_view in;
  string_view logging_function_03;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  char *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  string *psVar16;
  undefined4 uVar17;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  undefined1 in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd09;
  CNodeOptions *node_opts;
  uint16_t local_2e2;
  CNode *local_2d8;
  char local_2cc;
  undefined1 local_2a0 [16];
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_290;
  unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> i2p_transient_session;
  __normal_iterator<CService_*,_std::vector<CService,_std::allocator<CService>_>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  allocator<char> local_231;
  char *pszDest_local;
  bool proxyConnectionFailed;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock26;
  CService local_210;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock27;
  CAddress addr_bind;
  Proxy proxy;
  CService local_128;
  string log_msg;
  string local_78;
  uint16_t port;
  undefined6 uStack_56;
  undefined8 uStack_50;
  pointer local_48;
  long local_38;
  
  pszDest_local = (char *)CONCAT71(in_register_00000011,fCountFailure);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar13 = (int)CONCAT71(in_register_00000081,use_v2transport);
  if (iVar13 == 0) {
    __assert_fail("conn_type != ConnectionType::INBOUND",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                  ,0x187,
                  "CNode *CConnman::ConnectNode(CAddress, const char *, bool, ConnectionType, bool)"
                 );
  }
  args_2 = in_R9;
  if (pszDest_local == (char *)0x0) {
    bVar6 = IsLocal((CService *)pszDest);
    if (!bVar6) {
      CService::CService((CService *)&log_msg,(CService *)pszDest);
      pCVar10 = FindNode(this,(CService *)&log_msg);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&log_msg);
      if (pCVar10 == (CNode *)0x0) goto LAB_00173fd6;
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file_02._M_len = 0x50;
      logging_function_02._M_str = "ConnectNode";
      logging_function_02._M_len = 0xb;
      ::LogPrintf_<>(logging_function_02,source_file_02,0x191,ALL,Info,
                     "Failed to open new connection, already connected\n");
    }
    local_2d8 = (CNode *)0x0;
    goto LAB_00174efd;
  }
LAB_00173fd6:
  bVar6 = ::LogAcceptCategory(NET,Debug);
  local_2cc = (char)in_R9;
  if (bVar6) {
    pcVar14 = "v1";
    if (local_2cc != '\0') {
      pcVar14 = "v2";
    }
    if (pszDest_local == (char *)0x0) {
      CService::ToStringAddrPort_abi_cxx11_(&local_78,(CService *)pszDest);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,pszDest_local,&local_231);
    }
    dVar15 = 0.0;
    if (pszDest_local == (char *)0x0) {
      tVar8 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                        ();
      dVar15 = (double)((long)tVar8.__d.__r - *(long *)(pszDest + 0x28));
    }
    local_258._M_dataplus._M_p = (pointer)(dVar15 / 3600.0);
    pLVar9 = LogInstance();
    bVar6 = BCLog::Logger::Enabled(pLVar9);
    if (bVar6) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<char[3],std::__cxx11::string,double>
                ((string *)&proxy,(tinyformat *)"trying %s connection %s lastseen=%.1fhrs\n",pcVar14
                 ,(char (*) [3])&local_78,&local_258,args_2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &proxy);
      std::__cxx11::string::~string((string *)&proxy);
      pLVar9 = LogInstance();
      proxy.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect = &DAT_00000050;
      proxy.proxy.super_CNetAddr.m_addr._union._8_8_ = anon_var_dwarf_105745;
      in_stack_fffffffffffffce8 = 0x50;
      in_stack_fffffffffffffcec = 0;
      in_stack_fffffffffffffcf0 =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      in_stack_fffffffffffffd00 = 1;
      in_stack_fffffffffffffcf8 = 1;
      in_stack_fffffffffffffcfc = 0;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file._M_len = 0x50;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "ConnectNode";
      logging_function._M_len = 0xb;
      BCLog::Logger::LogPrintStr(pLVar9,str,logging_function,source_file,0x199,NET,Debug);
      std::__cxx11::string::~string((string *)&log_msg);
    }
    std::__cxx11::string::~string((string *)&local_78);
  }
  if (pszDest_local == (char *)0x0) {
    local_2e2 = this->m_params->nDefaultPort;
    pcVar14 = (char *)0x0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_msg,pszDest_local,(allocator<char> *)&proxy);
    local_2e2 = GetDefaultPort(this,&log_msg);
    std::__cxx11::string::~string((string *)&log_msg);
    pcVar14 = pszDest_local;
  }
  local_258.field_2._M_allocated_capacity = 0;
  local_258._M_dataplus._M_p = (pointer)0x0;
  local_258._M_string_length = 0;
  if (pcVar14 == (char *)0x0) {
    std::vector<CAddress,_std::allocator<CAddress>_>::push_back
              ((vector<CAddress,_std::allocator<CAddress>_> *)&local_258,(value_type *)pszDest);
LAB_0017465f:
    local_78._M_dataplus._M_p = (pointer)0x0;
    Proxy::Proxy(&proxy);
    CAddress::CAddress(&addr_bind);
    bVar6 = CNetAddr::IsValid((CNetAddr *)&addr_bind);
    sVar5 = local_258._M_string_length;
    psVar16 = (string *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8);
    if (bVar6) {
      __assert_fail("!addr_bind.IsValid()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                    ,0x1c5,
                    "CNode *CConnman::ConnectNode(CAddress, const char *, bool, ConnectionType, bool)"
                   );
    }
    node_opts = (CNodeOptions *)&this->m_unused_i2p_sessions_mutex;
    i2p_transient_session._M_t.
    super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t.
    super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
    super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
         (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
         (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
    this_00 = &this->m_unused_i2p_sessions;
    local_2d8 = (CNode *)0x0;
    sock._M_p = (pointer)0x0;
    for (address._M_p = local_258._M_dataplus._M_p; address._M_p != (pointer)sVar5;
        address._M_p = (pointer)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 ((long)address._M_p + 0x30))->_M_use_count) {
      bVar6 = CNetAddr::IsValid((CNetAddr *)address._M_p);
      port_00 = (uint16_t)(Connection *)&log_msg;
      if (bVar6) {
        net = CNetAddr::GetNetwork((CNetAddr *)address._M_p);
        bVar6 = GetProxy(net,&proxy);
        proxyConnectionFailed = false;
        if (bVar6 && ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)address._M_p + 0x10))->
                     _M_use_count == 4) {
          i2p::Connection::Connection((Connection *)&log_msg);
          this_01 = (this->m_i2p_sam_session)._M_t.
                    super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                    .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
          if (this_01 == (Session *)0x0) {
            UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                      (&criticalblock27,(AnnotatedMixin<std::mutex> *)node_opts,
                       "m_unused_i2p_sessions_mutex",
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                       ,0x1d5,false);
            puVar2 = (this->m_unused_i2p_sessions).c.
                     super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
            if ((this->m_unused_i2p_sessions).c.
                super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur == puVar2) {
              criticalblock26.super_unique_lock._M_device = (mutex_type *)&this->interruptNet;
              std::make_unique<i2p::sam::Session,Proxy&,CThreadInterrupt*>
                        ((Proxy *)&port,(CThreadInterrupt **)&proxy);
              __p = _port;
              _port = (Session *)0x0;
              std::__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::
              reset((__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                    &i2p_transient_session,(pointer)__p);
              std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::
              ~unique_ptr((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                          &port);
            }
            else {
              _Var3.
              super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t
              .super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
              super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
                   (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)
                   (puVar2->_M_t).
                   super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                   .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
              (puVar2->_M_t).
              super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t
              .super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
              super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
                   (Session *)
                   i2p_transient_session._M_t.
                   super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                   .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
              i2p_transient_session._M_t.
              super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t
              .super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
              super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
                   (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>
                    )(__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>
                      )_Var3.
                       super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                       .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
              std::
              deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
              ::pop_front(&this_00->c);
            }
            std::unique_lock<std::mutex>::~unique_lock(&criticalblock27.super_unique_lock);
            bVar6 = i2p::sam::Session::Connect
                              ((Session *)
                               i2p_transient_session._M_t.
                               super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                               .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl,
                               (CService *)address._M_p,(Connection *)&log_msg,
                               &proxyConnectionFailed);
            if (!bVar6) {
              UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                        (&criticalblock27,(AnnotatedMixin<std::mutex> *)node_opts,
                         "m_unused_i2p_sessions_mutex",
                         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                         ,0x1e0,false);
              sVar11 = std::
                       deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                       ::size(&this_00->c);
              uVar4 = i2p_transient_session;
              if (sVar11 < 10) {
                i2p_transient_session._M_t.
                super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
                _M_t.
                super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
                     (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>
                      )(__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)
                       0x0;
                _port = uVar4._M_t.
                        super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                        .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
                std::
                deque<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::allocator<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>>>
                ::emplace_back<i2p::sam::Session*>
                          ((deque<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::allocator<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>>>
                            *)this_00,(Session **)&port);
              }
              std::unique_lock<std::mutex>::~unique_lock(&criticalblock27.super_unique_lock);
              goto LAB_00174b25;
            }
LAB_00174a49:
            _Var12._M_p = log_msg._M_dataplus._M_p;
            log_msg._M_dataplus._M_p = (pointer)0x0;
            local_78._M_dataplus._M_p = _Var12._M_p;
            CService::CService(&local_210,(CService *)&log_msg._M_string_length);
            ipIn_00.super_CNetAddr.m_addr._union._4_4_ = in_stack_fffffffffffffcec;
            ipIn_00.super_CNetAddr.m_addr._union._0_4_ = in_stack_fffffffffffffce8;
            ipIn_00.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffffcf0;
            ipIn_00.super_CNetAddr.m_addr._size = (int)psVar16;
            ipIn_00.super_CNetAddr.m_addr._20_4_ = (int)((ulong)psVar16 >> 0x20);
            ipIn_00.super_CNetAddr.m_net = in_stack_fffffffffffffd00;
            ipIn_00.super_CNetAddr.m_scope_id = in_stack_fffffffffffffd04;
            ipIn_00.port._0_1_ = in_stack_fffffffffffffd08;
            ipIn_00._33_7_ = in_stack_fffffffffffffd09;
            CAddress::CAddress((CAddress *)&criticalblock27,ipIn_00,(ServiceFlags)&local_210);
            CAddress::operator=(&addr_bind,(CAddress *)&criticalblock27);
            prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock27);
            prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_210);
            sock._M_p = _Var12._M_p;
          }
          else {
            bVar6 = i2p::sam::Session::Connect
                              (this_01,(CService *)address._M_p,(Connection *)&log_msg,
                               &proxyConnectionFailed);
            if (bVar6) goto LAB_00174a49;
LAB_00174b25:
            _Var12._M_p = (pointer)0x0;
          }
          i2p::Connection::~Connection((Connection *)&log_msg);
        }
        else if (bVar6) {
          bVar6 = ::LogAcceptCategory(PROXY,Debug);
          if (bVar6) {
            Proxy::ToString_abi_cxx11_(&log_msg,&proxy);
            CService::ToStringAddrPort_abi_cxx11_
                      ((string *)&criticalblock27,(CService *)address._M_p);
            in_stack_fffffffffffffce8 = 0x69bc1a;
            in_stack_fffffffffffffcec = 0;
            source_file_03._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
            source_file_03._M_len = 0x50;
            logging_function_03._M_str = "ConnectNode";
            logging_function_03._M_len = 0xb;
            in_stack_fffffffffffffcf0 = (char *)&log_msg;
            psVar16 = (string *)&criticalblock27;
            LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                      (logging_function_03,source_file_03,0x1ec,PROXY,0x69bc1a,(char *)&log_msg,
                       (string *)&criticalblock27,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
            std::__cxx11::string::~string((string *)&criticalblock27);
            std::__cxx11::string::~string((string *)&log_msg);
          }
          CNetAddr::ToStringAddr_abi_cxx11_(&log_msg,(CNetAddr *)address._M_p);
          uVar7 = CService::GetPort((CService *)address._M_p);
          ConnectThroughProxy((Proxy *)&criticalblock27,(string *)&proxy,port_00,
                              (bool *)(ulong)uVar7);
          _Var12._M_p = (pointer)criticalblock27.super_unique_lock._M_device;
          local_78._M_dataplus._M_p = (pointer)criticalblock27.super_unique_lock._M_device;
          criticalblock27.super_unique_lock._M_device = (mutex_type *)0x0;
          std::__cxx11::string::~string((string *)&log_msg);
          sock._M_p = _Var12._M_p;
        }
        else {
          ConnectDirectly((CService *)&log_msg,SUB81(address._M_p,0));
          local_78._M_dataplus._M_p = log_msg._M_dataplus._M_p;
          _Var12 = log_msg._M_dataplus;
          sock = log_msg._M_dataplus;
        }
        if (proxyConnectionFailed == false) {
          this_02 = this->addrman;
          tVar8 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                            ();
          AddrMan::Attempt(this_02,(CService *)address._M_p,SUB41(conn_type,0),
                           (NodeSeconds)tVar8.__d.__r);
        }
LAB_00174b5c:
        if ((mutex_type *)_Var12._M_p != (mutex_type *)0x0) {
          criticalblock26.super_unique_lock._M_device =
               (mutex_type *)
               ((ulong)criticalblock26.super_unique_lock._M_device & 0xffffffff00000000);
          if (iVar13 == 2) {
            std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::vector
                      ((vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
                       &port,&this->vWhitelistedRangeOutgoing);
          }
          else {
            _port = (Session *)0x0;
            uStack_50 = 0;
            local_48 = (pointer)0x0;
          }
          AddWhitelistPermissionFlags
                    (this,(NetPermissionFlags *)&criticalblock26,(CNetAddr *)address._M_p,
                     (vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
                     &port);
          LOCK();
          paVar1 = &this->nLastNodeId;
          data = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
          UNLOCK();
          GetDeterministicRandomizer((CSipHasher *)&log_msg,this,0xd93e69e2bbfa5735);
          this_03 = CSipHasher::Write((CSipHasher *)&log_msg,data);
          nKeyedNetGroupIn = CSipHasher::Finalize(this_03);
          bVar6 = CNetAddr::IsValid((CNetAddr *)&addr_bind);
          if (!bVar6) {
            GetBindAddress((CAddress *)&log_msg,(Sock *)sock._M_p);
            CAddress::operator=(&addr_bind,(CAddress *)&log_msg);
            prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&log_msg);
          }
          local_2d8 = (CNode *)operator_new(0x3a8);
          std::__shared_ptr<Sock,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<Sock,std::default_delete<Sock>,void>
                    ((__shared_ptr<Sock,(__gnu_cxx::_Lock_policy)2> *)local_2a0,
                     (unique_ptr<Sock,_std::default_delete<Sock>_> *)&local_78);
          uVar17 = (undefined4)((ulong)psVar16 >> 0x20);
          addrIn = (CAddress *)CalculateKeyedNetGroup(this,(CAddress *)address._M_p);
          pcVar14 = "";
          if (pszDest_local != (char *)0x0) {
            pcVar14 = pszDest_local;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&criticalblock27,pcVar14,(allocator<char> *)&proxyConnectionFailed);
          log_msg._M_dataplus._M_p._0_4_ = criticalblock26.super_unique_lock._M_device._0_4_;
          log_msg._M_string_length =
               (size_type)
               i2p_transient_session._M_t.
               super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
               _M_t.
               super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
               super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
          i2p_transient_session._M_t.
          super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t.
          super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
          super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
               (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>
                )(__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
          log_msg.field_2._M_local_buf[0] = '\0';
          log_msg.field_2._8_8_ = ZEXT48(this->nReceiveFloodSize);
          sock_00.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)address._M_p;
          sock_00.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_2a0;
          CNode::CNode(local_2d8,data,sock_00,addrIn,nKeyedNetGroupIn,(uint64_t)&addr_bind,
                       (CAddress *)&criticalblock27,(string *)CONCAT44(uVar17,iVar13),INBOUND,false,
                       node_opts);
          std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
                    ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                     &log_msg._M_string_length);
          std::__cxx11::string::~string((string *)&criticalblock27);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2a0 + 8));
          LOCK();
          (local_2d8->nRefCount).super___atomic_base<int>._M_i =
               (local_2d8->nRefCount).super___atomic_base<int>._M_i + 1;
          UNLOCK();
          RandAddEvent((uint32_t)data);
          std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::~vector
                    ((vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
                     &port);
          break;
        }
      }
      else if ((pszDest_local != (char *)0x0) && (bVar6 = GetNameProxy(&proxy), bVar6)) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        port = local_2e2;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&criticalblock27,pszDest_local,(allocator<char> *)&criticalblock26);
        in._M_str = (char *)criticalblock27.super_unique_lock._M_device;
        in._M_len = criticalblock27.super_unique_lock._8_8_;
        SplitHostPort(in,&port,&log_msg);
        std::__cxx11::string::~string((string *)&criticalblock27);
        ConnectThroughProxy((Proxy *)&criticalblock27,(string *)&proxy,port_00,
                            (bool *)(_port & 0xffff));
        _Var12._M_p = (pointer)criticalblock27.super_unique_lock._M_device;
        local_78._M_dataplus._M_p = (pointer)criticalblock27.super_unique_lock._M_device;
        std::__cxx11::string::~string((string *)&log_msg);
        sock._M_p = _Var12._M_p;
        goto LAB_00174b5c;
      }
    }
    std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
              (&i2p_transient_session);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_bind);
    Proxy::~Proxy(&proxy);
    if ((mutex_type *)local_78._M_dataplus._M_p != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_msg,pcVar14,(allocator<char> *)&proxy);
    if (fNameLookup == true) {
      bVar6 = HaveNameProxy();
      bVar6 = !bVar6;
    }
    else {
      bVar6 = false;
    }
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function(&local_290,&g_dns_lookup_abi_cxx11_);
    pcVar14 = (char *)0x100;
    dns_lookup_function.super__Function_base._M_functor._4_4_ = in_stack_fffffffffffffcec;
    dns_lookup_function.super__Function_base._M_functor._0_4_ = in_stack_fffffffffffffce8;
    dns_lookup_function.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffcf0;
    dns_lookup_function.super__Function_base._M_manager._0_4_ = in_stack_fffffffffffffcf8;
    dns_lookup_function.super__Function_base._M_manager._4_4_ = in_stack_fffffffffffffcfc;
    dns_lookup_function._M_invoker._0_4_ = in_stack_fffffffffffffd00;
    dns_lookup_function._M_invoker._4_4_ = in_stack_fffffffffffffd04;
    Lookup((vector<CService,_std::allocator<CService>_> *)&i2p_transient_session,&log_msg,local_2e2,
           bVar6,0x100,dns_lookup_function);
    std::_Function_base::~_Function_base(&local_290.super__Function_base);
    std::__cxx11::string::~string((string *)&log_msg);
    uVar4 = i2p_transient_session;
    if (i2p_transient_session._M_t.
        super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t.
        super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
        super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl ==
        (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
        local_268._M_current) {
      std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                ((vector<CAddress,_std::allocator<CAddress>_> *)&local_258,(value_type *)pszDest);
LAB_00174652:
      std::vector<CService,_std::allocator<CService>_>::~vector
                ((vector<CService,_std::allocator<CService>_> *)&i2p_transient_session);
      goto LAB_0017465f;
    }
    FastRandomContext::FastRandomContext((FastRandomContext *)&log_msg,false);
    std::
    shuffle<__gnu_cxx::__normal_iterator<CService*,std::vector<CService,std::allocator<CService>>>,FastRandomContext>
              ((__normal_iterator<CService_*,_std::vector<CService,_std::allocator<CService>_>_>)
               uVar4._M_t.
               super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
               _M_t.
               super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
               super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl,local_268,
               (FastRandomContext *)&log_msg);
    ChaCha20::~ChaCha20((ChaCha20 *)&log_msg.field_2);
    service._M_t.
    super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
    super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
         (tuple<i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>)
         (tuple<i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>)i2p_transient_session;
    do {
      if (service._M_t.
          super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
          super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl ==
          (tuple<i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>)local_268._M_current)
      goto LAB_00174652;
      MaybeFlipIPv6toCJDNS
                (&local_128,
                 (CService *)
                 service._M_t.
                 super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                 .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl);
      ipIn.super_CNetAddr.m_addr._union._4_4_ = in_stack_fffffffffffffcec;
      ipIn.super_CNetAddr.m_addr._union._0_4_ = in_stack_fffffffffffffce8;
      ipIn.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffffcf0;
      ipIn.super_CNetAddr.m_addr._size = in_stack_fffffffffffffcf8;
      ipIn.super_CNetAddr.m_addr._20_4_ = in_stack_fffffffffffffcfc;
      ipIn.super_CNetAddr.m_net = in_stack_fffffffffffffd00;
      ipIn.super_CNetAddr.m_scope_id = in_stack_fffffffffffffd04;
      ipIn.port._0_1_ = in_stack_fffffffffffffd08;
      ipIn._33_7_ = in_stack_fffffffffffffd09;
      CAddress::CAddress((CAddress *)&log_msg,ipIn,(ServiceFlags)&local_128);
      CAddress::operator=((CAddress *)pszDest,(CAddress *)&log_msg);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&log_msg);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_128);
      bVar6 = CNetAddr::IsValid((CNetAddr *)pszDest);
      if (!bVar6) {
        bVar6 = ::LogAcceptCategory(NET,Debug);
        if (bVar6) {
          CService::ToStringAddrPort_abi_cxx11_(&local_78,(CService *)pszDest);
          pLVar9 = LogInstance();
          bVar6 = BCLog::Logger::Enabled(pLVar9);
          if (bVar6) {
            log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
            log_msg._M_string_length = 0;
            log_msg.field_2._M_local_buf[0] = '\0';
            tinyformat::format<std::__cxx11::string,char_const*>
                      ((string *)&proxy,
                       (tinyformat *)"Resolver returned invalid address %s for %s\n",
                       (char *)&local_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pszDest_local,(char **)pcVar14);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&log_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &proxy);
            std::__cxx11::string::~string((string *)&proxy);
            pLVar9 = LogInstance();
            proxy.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect = &DAT_00000050;
            proxy.proxy.super_CNetAddr.m_addr._union._8_8_ = anon_var_dwarf_105745;
            source_file_01._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
            source_file_01._M_len = 0x50;
            str_01._M_str = log_msg._M_dataplus._M_p;
            str_01._M_len = log_msg._M_string_length;
            logging_function_01._M_str = "ConnectNode";
            logging_function_01._M_len = 0xb;
            BCLog::Logger::LogPrintStr
                      (pLVar9,str_01,logging_function_01,source_file_01,0x1aa,NET,Debug);
            std::__cxx11::string::~string((string *)&log_msg);
          }
          std::__cxx11::string::~string((string *)&local_78);
        }
        break;
      }
      pcVar14 = (char *)0x1af;
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                (&criticalblock26,&this->m_nodes_mutex,"m_nodes_mutex",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
                 0x1af,false);
      CService::CService((CService *)&log_msg,(CService *)pszDest);
      pCVar10 = FindNode(this,(CService *)&log_msg);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&log_msg);
      if (pCVar10 == (CNode *)0x0) {
        std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                  ((vector<CAddress,_std::allocator<CAddress>_> *)&local_258,(value_type *)pszDest);
      }
      else {
        CService::ToStringAddrPort_abi_cxx11_(&local_78,(CService *)pszDest);
        pLVar9 = LogInstance();
        bVar6 = BCLog::Logger::Enabled(pLVar9);
        if (bVar6) {
          log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
          log_msg._M_string_length = 0;
          log_msg.field_2._M_local_buf[0] = '\0';
          tinyformat::format<char_const*,std::__cxx11::string>
                    ((string *)&proxy,
                     (tinyformat *)"Not opening a connection to %s, already connected to %s\n",
                     (char *)&pszDest_local,(char **)&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar14);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&log_msg,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&proxy);
          std::__cxx11::string::~string((string *)&proxy);
          pLVar9 = LogInstance();
          proxy.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect = &DAT_00000050;
          proxy.proxy.super_CNetAddr.m_addr._union._8_8_ = anon_var_dwarf_105745;
          in_stack_fffffffffffffce8 = 0x50;
          in_stack_fffffffffffffcec = 0;
          in_stack_fffffffffffffcf0 =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
          in_stack_fffffffffffffcf8 = 0xffffffff;
          in_stack_fffffffffffffcfc = 0xffffffff;
          in_stack_fffffffffffffd00 = 2;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
          source_file_00._M_len = 0x50;
          str_00._M_str = log_msg._M_dataplus._M_p;
          str_00._M_len = log_msg._M_string_length;
          logging_function_00._M_str = "ConnectNode";
          logging_function_00._M_len = 0xb;
          pcVar14 = "ConnectNode";
          BCLog::Logger::LogPrintStr
                    (pLVar9,str_00,logging_function_00,source_file_00,0x1b2,ALL,Info);
          std::__cxx11::string::~string((string *)&log_msg);
        }
        std::__cxx11::string::~string((string *)&local_78);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock26.super_unique_lock);
      service._M_t.
      super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
      super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
           (tuple<i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>)
           ((long)service._M_t.
                  super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                  .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl + 0x28);
    } while (pCVar10 == (CNode *)0x0);
    std::vector<CService,_std::allocator<CService>_>::~vector
              ((vector<CService,_std::allocator<CService>_> *)&i2p_transient_session);
    local_2d8 = (CNode *)0x0;
  }
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_258);
LAB_00174efd:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_2d8;
}

Assistant:

CNode* CConnman::ConnectNode(CAddress addrConnect, const char *pszDest, bool fCountFailure, ConnectionType conn_type, bool use_v2transport)
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    assert(conn_type != ConnectionType::INBOUND);

    if (pszDest == nullptr) {
        if (IsLocal(addrConnect))
            return nullptr;

        // Look for an existing connection
        CNode* pnode = FindNode(static_cast<CService>(addrConnect));
        if (pnode)
        {
            LogPrintf("Failed to open new connection, already connected\n");
            return nullptr;
        }
    }

    LogPrintLevel(BCLog::NET, BCLog::Level::Debug, "trying %s connection %s lastseen=%.1fhrs\n",
        use_v2transport ? "v2" : "v1",
        pszDest ? pszDest : addrConnect.ToStringAddrPort(),
        Ticks<HoursDouble>(pszDest ? 0h : Now<NodeSeconds>() - addrConnect.nTime));

    // Resolve
    const uint16_t default_port{pszDest != nullptr ? GetDefaultPort(pszDest) :
                                                     m_params.GetDefaultPort()};

    // Collection of addresses to try to connect to: either all dns resolved addresses if a domain name (pszDest) is provided, or addrConnect otherwise.
    std::vector<CAddress> connect_to{};
    if (pszDest) {
        std::vector<CService> resolved{Lookup(pszDest, default_port, fNameLookup && !HaveNameProxy(), 256)};
        if (!resolved.empty()) {
            std::shuffle(resolved.begin(), resolved.end(), FastRandomContext());
            // If the connection is made by name, it can be the case that the name resolves to more than one address.
            // We don't want to connect any more of them if we are already connected to one
            for (const auto& r : resolved) {
                addrConnect = CAddress{MaybeFlipIPv6toCJDNS(r), NODE_NONE};
                if (!addrConnect.IsValid()) {
                    LogDebug(BCLog::NET, "Resolver returned invalid address %s for %s\n", addrConnect.ToStringAddrPort(), pszDest);
                    return nullptr;
                }
                // It is possible that we already have a connection to the IP/port pszDest resolved to.
                // In that case, drop the connection that was just created.
                LOCK(m_nodes_mutex);
                CNode* pnode = FindNode(static_cast<CService>(addrConnect));
                if (pnode) {
                    LogPrintf("Not opening a connection to %s, already connected to %s\n", pszDest, addrConnect.ToStringAddrPort());
                    return nullptr;
                }
                // Add the address to the resolved addresses vector so we can try to connect to it later on
                connect_to.push_back(addrConnect);
            }
        } else {
            // For resolution via proxy
            connect_to.push_back(addrConnect);
        }
    } else {
        // Connect via addrConnect directly
        connect_to.push_back(addrConnect);
    }

    // Connect
    std::unique_ptr<Sock> sock;
    Proxy proxy;
    CAddress addr_bind;
    assert(!addr_bind.IsValid());
    std::unique_ptr<i2p::sam::Session> i2p_transient_session;

    for (auto& target_addr: connect_to) {
        if (target_addr.IsValid()) {
            const bool use_proxy{GetProxy(target_addr.GetNetwork(), proxy)};
            bool proxyConnectionFailed = false;

            if (target_addr.IsI2P() && use_proxy) {
                i2p::Connection conn;
                bool connected{false};

                if (m_i2p_sam_session) {
                    connected = m_i2p_sam_session->Connect(target_addr, conn, proxyConnectionFailed);
                } else {
                    {
                        LOCK(m_unused_i2p_sessions_mutex);
                        if (m_unused_i2p_sessions.empty()) {
                            i2p_transient_session =
                                std::make_unique<i2p::sam::Session>(proxy, &interruptNet);
                        } else {
                            i2p_transient_session.swap(m_unused_i2p_sessions.front());
                            m_unused_i2p_sessions.pop();
                        }
                    }
                    connected = i2p_transient_session->Connect(target_addr, conn, proxyConnectionFailed);
                    if (!connected) {
                        LOCK(m_unused_i2p_sessions_mutex);
                        if (m_unused_i2p_sessions.size() < MAX_UNUSED_I2P_SESSIONS_SIZE) {
                            m_unused_i2p_sessions.emplace(i2p_transient_session.release());
                        }
                    }
                }

                if (connected) {
                    sock = std::move(conn.sock);
                    addr_bind = CAddress{conn.me, NODE_NONE};
                }
            } else if (use_proxy) {
                LogPrintLevel(BCLog::PROXY, BCLog::Level::Debug, "Using proxy: %s to connect to %s\n", proxy.ToString(), target_addr.ToStringAddrPort());
                sock = ConnectThroughProxy(proxy, target_addr.ToStringAddr(), target_addr.GetPort(), proxyConnectionFailed);
            } else {
                // no proxy needed (none set for target network)
                sock = ConnectDirectly(target_addr, conn_type == ConnectionType::MANUAL);
            }
            if (!proxyConnectionFailed) {
                // If a connection to the node was attempted, and failure (if any) is not caused by a problem connecting to
                // the proxy, mark this as an attempt.
                addrman.Attempt(target_addr, fCountFailure);
            }
        } else if (pszDest && GetNameProxy(proxy)) {
            std::string host;
            uint16_t port{default_port};
            SplitHostPort(std::string(pszDest), port, host);
            bool proxyConnectionFailed;
            sock = ConnectThroughProxy(proxy, host, port, proxyConnectionFailed);
        }
        // Check any other resolved address (if any) if we fail to connect
        if (!sock) {
            continue;
        }

        NetPermissionFlags permission_flags = NetPermissionFlags::None;
        std::vector<NetWhitelistPermissions> whitelist_permissions = conn_type == ConnectionType::MANUAL ? vWhitelistedRangeOutgoing : std::vector<NetWhitelistPermissions>{};
        AddWhitelistPermissionFlags(permission_flags, target_addr, whitelist_permissions);

        // Add node
        NodeId id = GetNewNodeId();
        uint64_t nonce = GetDeterministicRandomizer(RANDOMIZER_ID_LOCALHOSTNONCE).Write(id).Finalize();
        if (!addr_bind.IsValid()) {
            addr_bind = GetBindAddress(*sock);
        }
        CNode* pnode = new CNode(id,
                                std::move(sock),
                                target_addr,
                                CalculateKeyedNetGroup(target_addr),
                                nonce,
                                addr_bind,
                                pszDest ? pszDest : "",
                                conn_type,
                                /*inbound_onion=*/false,
                                CNodeOptions{
                                    .permission_flags = permission_flags,
                                    .i2p_sam_session = std::move(i2p_transient_session),
                                    .recv_flood_size = nReceiveFloodSize,
                                    .use_v2transport = use_v2transport,
                                });
        pnode->AddRef();

        // We're making a new connection, harvest entropy from the time (and our peer count)
        RandAddEvent((uint32_t)id);

        return pnode;
    }

    return nullptr;
}